

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

opj_bool jp2_exec(opj_jp2_v2_t *jp2,opj_procedure_list_t *p_procedure_list,opj_stream_private_t *cio
                 ,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  opj_procedure *ppvVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  OVar1 = opj_procedure_list_get_nb_procedures(p_procedure_list);
  ppvVar3 = opj_procedure_list_get_first_procedure(p_procedure_list);
  if (OVar1 == 0) {
    uVar4 = 1;
  }
  else {
    uVar4 = 1;
    lVar5 = 0;
    do {
      bVar6 = uVar4 != 0;
      uVar4 = 0;
      if (bVar6) {
        iVar2 = (*(code *)ppvVar3[lVar5])(jp2,cio,p_manager);
        uVar4 = (uint)(iVar2 != 0);
      }
      lVar5 = lVar5 + 1;
    } while (OVar1 != (OPJ_UINT32)lVar5);
  }
  opj_procedure_list_clear(p_procedure_list);
  return uVar4;
}

Assistant:

opj_bool jp2_exec (
					opj_jp2_v2_t * jp2,
					opj_procedure_list_t * p_procedure_list,
					opj_stream_private_t *cio,
					opj_event_mgr_t * p_manager
				  )
{
	opj_bool (** l_procedure) (opj_jp2_v2_t * jp2, opj_stream_private_t *, opj_event_mgr_t *) = 00;
	opj_bool l_result = OPJ_TRUE;
	OPJ_UINT32 l_nb_proc, i;

	/* preconditions */
	assert(p_procedure_list != 00);
	assert(jp2 != 00);
	assert(cio != 00);
	assert(p_manager != 00);

	l_nb_proc = opj_procedure_list_get_nb_procedures(p_procedure_list);
	l_procedure = (opj_bool (**) (opj_jp2_v2_t * jp2, opj_stream_private_t *, opj_event_mgr_t *)) opj_procedure_list_get_first_procedure(p_procedure_list);

	for	(i=0;i<l_nb_proc;++i) {
		l_result = l_result && (*l_procedure) (jp2,cio,p_manager);
		++l_procedure;
	}

	/* and clear the procedure list at the end. */
	opj_procedure_list_clear(p_procedure_list);
	return l_result;
}